

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::PluralFormat::format
          (PluralFormat *this,Formattable *numberObject,double number,UnicodeString *appendTo,
          FieldPosition *pos,UErrorCode *status)

{
  UnicodeString *src;
  DecimalQuantity *this_00;
  NumberFormat *this_01;
  Part *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  DecimalFormat *this_02;
  LocalizedNumberFormatter *this_03;
  undefined4 srcLength;
  int start;
  long lVar3;
  int32_t *piVar4;
  int srcStart;
  UMessagePatternPartType UVar5;
  double n;
  UnicodeString numberString;
  UFormattedNumberData data;
  Part *local_248;
  UnicodeString local_238;
  Formattable local_1f8;
  UFormattedNumberData local_188;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((this->msgPattern).partsLength == 0) {
      iVar2 = (*(this->numberFormat->super_Format).super_UObject._vptr_UObject[5])
                        (this->numberFormat,numberObject,appendTo,pos,status);
      return (UnicodeString *)CONCAT44(extraout_var,iVar2);
    }
    n = number - this->offset;
    this_00 = &local_188.quantity;
    local_188.fMagic = 0x46444e00;
    icu_63::number::impl::DecimalQuantity::DecimalQuantity(this_00);
    icu_63::number::impl::NumberStringBuilder::NumberStringBuilder(&local_188.string);
    if ((this->offset != 0.0) || (NAN(this->offset))) {
      icu_63::number::impl::DecimalQuantity::setToDouble(this_00,n);
    }
    else {
      Formattable::populateDecimalQuantity(numberObject,this_00,status);
    }
    local_238.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003febe0;
    local_238.fUnion.fStackFields.fLengthAndFlags = 2;
    this_01 = this->numberFormat;
    if ((this_01 == (NumberFormat *)0x0) ||
       (this_02 = (DecimalFormat *)
                  __dynamic_cast(this_01,&NumberFormat::typeinfo,&DecimalFormat::typeinfo,0),
       this_02 == (DecimalFormat *)0x0)) {
      if ((this->offset != 0.0) || (NAN(this->offset))) {
        Formattable::Formattable(&local_1f8,n);
        Format::format(&this_01->super_Format,&local_1f8,&local_238,status);
        Formattable::~Formattable(&local_1f8);
      }
      else {
        Format::format(&this_01->super_Format,numberObject,&local_238,status);
      }
    }
    else {
      this_03 = DecimalFormat::toNumberFormatter(this_02);
      icu_63::number::LocalizedNumberFormatter::formatImpl(this_03,&local_188,status);
      icu_63::number::impl::NumberStringBuilder::toUnicodeString
                ((UnicodeString *)&local_1f8,&local_188.string);
      UnicodeString::moveFrom(&local_238,(UnicodeString *)&local_1f8);
      UnicodeString::~UnicodeString((UnicodeString *)&local_1f8);
    }
    iVar2 = findSubMessage(&this->msgPattern,0,&(this->pluralRulesWrapper).super_PluralSelector,
                           this_00,number,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      src = &(this->msgPattern).msg;
      pPVar1 = (this->msgPattern).parts;
      lVar3 = (long)iVar2;
      srcStart = (uint)pPVar1[lVar3].length + pPVar1[lVar3].index;
      lVar3 = lVar3 + 1;
      UVar5 = pPVar1[lVar3].type;
      start = pPVar1[lVar3].index;
      if (UVar5 != UMSGPAT_PART_TYPE_MSG_LIMIT) {
        local_248 = pPVar1 + lVar3;
        piVar4 = &pPVar1[lVar3].index;
        do {
          iVar2 = iVar2 + 1;
          if (UVar5 == UMSGPAT_PART_TYPE_REPLACE_NUMBER) {
LAB_0028370d:
            UnicodeString::doAppend(appendTo,src,srcStart,start - srcStart);
            if (UVar5 == UMSGPAT_PART_TYPE_REPLACE_NUMBER) {
              srcLength = local_238.fUnion.fFields.fLength;
              if (-1 < local_238.fUnion.fStackFields.fLengthAndFlags) {
                srcLength = (int)local_238.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              UnicodeString::doAppend(appendTo,&local_238,0,srcLength);
            }
            srcStart = (uint)local_248->length + *piVar4;
          }
          else if (UVar5 == UMSGPAT_PART_TYPE_ARG_START) {
            UnicodeString::doAppend(appendTo,src,srcStart,start - srcStart);
            pPVar1 = (this->msgPattern).parts;
            if (iVar2 < pPVar1[lVar3].limitPartIndex) {
              iVar2 = pPVar1[lVar3].limitPartIndex;
            }
            srcStart = (uint)pPVar1[iVar2].length + pPVar1[iVar2].index;
            MessageImpl::appendReducedApostrophes(src,start,srcStart,appendTo);
          }
          else if ((UVar5 == UMSGPAT_PART_TYPE_SKIP_SYNTAX) &&
                  ((this->msgPattern).aposMode == UMSGPAT_APOS_DOUBLE_REQUIRED)) goto LAB_0028370d;
          lVar3 = (long)iVar2 + 1;
          pPVar1 = (this->msgPattern).parts;
          local_248 = pPVar1 + lVar3;
          pPVar1 = pPVar1 + lVar3;
          piVar4 = &pPVar1->index;
          UVar5 = pPVar1->type;
          start = *piVar4;
        } while (UVar5 != UMSGPAT_PART_TYPE_MSG_LIMIT);
      }
      appendTo = UnicodeString::doAppend(appendTo,src,srcStart,start - srcStart);
    }
    UnicodeString::~UnicodeString(&local_238);
    icu_63::number::impl::NumberStringBuilder::~NumberStringBuilder(&local_188.string);
    icu_63::number::impl::DecimalQuantity::~DecimalQuantity(&local_188.quantity);
  }
  return appendTo;
}

Assistant:

UnicodeString&
PluralFormat::format(const Formattable& numberObject, double number,
                     UnicodeString& appendTo,
                     FieldPosition& pos,
                     UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return appendTo;
    }
    if (msgPattern.countParts() == 0) {
        return numberFormat->format(numberObject, appendTo, pos, status);
    }

    // Get the appropriate sub-message.
    // Select it based on the formatted number-offset.
    double numberMinusOffset = number - offset;
    // Call NumberFormatter to get both the DecimalQuantity and the string.
    // This call site needs to use more internal APIs than the Java equivalent.
    number::impl::UFormattedNumberData data;
    if (offset == 0) {
        // could be BigDecimal etc.
        numberObject.populateDecimalQuantity(data.quantity, status);
    } else {
        data.quantity.setToDouble(numberMinusOffset);
    }
    UnicodeString numberString;
    auto *decFmt = dynamic_cast<DecimalFormat *>(numberFormat);
    if(decFmt != nullptr) {
        decFmt->toNumberFormatter().formatImpl(&data, status); // mutates &data
        numberString = data.string.toUnicodeString();
    } else {
        if (offset == 0) {
            numberFormat->format(numberObject, numberString, status);
        } else {
            numberFormat->format(numberMinusOffset, numberString, status);
        }
    }

    int32_t partIndex = findSubMessage(msgPattern, 0, pluralRulesWrapper, &data.quantity, number, status);
    if (U_FAILURE(status)) { return appendTo; }
    // Replace syntactic # signs in the top level of this sub-message
    // (not in nested arguments) with the formatted number-offset.
    const UnicodeString& pattern = msgPattern.getPatternString();
    int32_t prevIndex = msgPattern.getPart(partIndex).getLimit();
    for (;;) {
        const MessagePattern::Part& part = msgPattern.getPart(++partIndex);
        const UMessagePatternPartType type = part.getType();
        int32_t index = part.getIndex();
        if (type == UMSGPAT_PART_TYPE_MSG_LIMIT) {
            return appendTo.append(pattern, prevIndex, index - prevIndex);
        } else if ((type == UMSGPAT_PART_TYPE_REPLACE_NUMBER) ||
            (type == UMSGPAT_PART_TYPE_SKIP_SYNTAX && MessageImpl::jdkAposMode(msgPattern))) {
            appendTo.append(pattern, prevIndex, index - prevIndex);
            if (type == UMSGPAT_PART_TYPE_REPLACE_NUMBER) {
                appendTo.append(numberString);
            }
            prevIndex = part.getLimit();
        } else if (type == UMSGPAT_PART_TYPE_ARG_START) {
            appendTo.append(pattern, prevIndex, index - prevIndex);
            prevIndex = index;
            partIndex = msgPattern.getLimitPartIndex(partIndex);
            index = msgPattern.getPart(partIndex).getLimit();
            MessageImpl::appendReducedApostrophes(pattern, prevIndex, index, appendTo);
            prevIndex = index;
        }
    }
}